

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

boolean decode_mcu_sub(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  d_derived_tbl *pdVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  jpeg_source_mgr *pjVar9;
  int bits_left;
  ulong uVar10;
  _func_void_j_decompress_ptr *get_buffer;
  int min_bits;
  int iVar11;
  uint uVar12;
  j_decompress_ptr pjVar13;
  bitread_working_state br_state;
  savable_state state;
  bitread_working_state local_a0;
  int local_74;
  long local_70;
  j_decompress_ptr local_68;
  JBLOCKROW local_60;
  undefined8 local_58;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Stack_50;
  undefined4 local_48;
  JBLOCKROW *local_40;
  int *local_38;
  
  pjVar1 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar1[3].decode_mcu != 0)) ||
     (bVar3 = process_restart(cinfo), bVar3 != 0)) {
    if (*(int *)((long)&pjVar1[3].start_pass + 4) == 0) {
      local_38 = cinfo->natural_order;
      local_74 = cinfo->lim_Se;
      pjVar9 = cinfo->src;
      local_a0.next_input_byte = pjVar9->next_input_byte;
      local_a0.bytes_in_buffer = pjVar9->bytes_in_buffer;
      get_buffer = pjVar1[1].start_pass;
      bits_left = *(int *)&pjVar1[1].decode_mcu;
      local_48 = *(undefined4 *)&pjVar1[3].start_pass;
      local_58 = pjVar1[2].start_pass;
      p_Stack_50 = pjVar1[2].decode_mcu;
      if (0 < cinfo->blocks_in_MCU) {
        local_70 = 0;
        local_40 = MCU_data;
        local_a0.cinfo = cinfo;
        local_68 = cinfo;
        do {
          local_60 = local_40[local_70];
          pdVar2 = (d_derived_tbl *)(&pjVar1[10].decode_mcu)[local_70];
          if (bits_left < 8) {
            bVar3 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar3 == 0) {
              return 0;
            }
            get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
            bits_left = local_a0.bits_left;
            if (7 < local_a0.bits_left) goto LAB_00112809;
            uVar4 = jpeg_huff_decode(&local_a0,local_a0.get_buffer,local_a0.bits_left,pdVar2,1);
            pjVar13 = local_68;
LAB_00112849:
            get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
            bits_left = local_a0.bits_left;
            if ((int)uVar4 < 0) goto LAB_00112b75;
          }
          else {
LAB_00112809:
            pjVar13 = local_68;
            uVar8 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (pdVar2->look_nbits[uVar8] == 0) {
              uVar4 = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,pdVar2,9);
              goto LAB_00112849;
            }
            uVar4 = (uint)pdVar2->look_sym[uVar8];
            bits_left = bits_left - pdVar2->look_nbits[uVar8];
          }
          pdVar2 = (d_derived_tbl *)(&pjVar1[0xf].decode_mcu)[local_70];
          iVar11 = *(int *)((long)&pjVar1[0x14].decode_mcu + local_70 * 4);
          if (iVar11 == 0) {
            iVar6 = 1;
            if (uVar4 != 0) {
              if ((bits_left < (int)uVar4) &&
                 (bVar3 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,uVar4),
                 get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                 bits_left = local_a0.bits_left, bVar3 == 0)) goto LAB_00112b75;
              bits_left = bits_left - uVar4;
            }
          }
          else {
            if (uVar4 == 0) {
              iVar6 = 0;
            }
            else {
              if ((bits_left < (int)uVar4) &&
                 (bVar3 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,uVar4),
                 get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                 bits_left = local_a0.bits_left, bVar3 == 0)) goto LAB_00112b75;
              bits_left = bits_left - uVar4;
              uVar12 = bmask[uVar4];
              uVar5 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & uVar12;
              if (bmask[uVar4 - 1] < (int)uVar5) {
                uVar12 = 0;
              }
              iVar6 = uVar5 - uVar12;
            }
            iVar6 = iVar6 + *(int *)((long)&local_58 +
                                    (long)pjVar13->MCU_membership[local_70] * 4 + 4);
            *(int *)((long)&local_58 + (long)pjVar13->MCU_membership[local_70] * 4 + 4) = iVar6;
            (*local_60)[0] = (JCOEF)iVar6;
            iVar6 = 1;
            if (1 < iVar11) {
              iVar6 = 1;
              do {
                if (bits_left < 8) {
                  bVar3 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
                  if (bVar3 == 0) {
                    return 0;
                  }
                  get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                  bits_left = local_a0.bits_left;
                  if (7 < local_a0.bits_left) goto LAB_00112976;
                  min_bits = 1;
LAB_001129a9:
                  uVar4 = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,pdVar2,
                                           min_bits);
                  get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                  bits_left = local_a0.bits_left;
                  if ((int)uVar4 < 0) goto LAB_00112b75;
                }
                else {
LAB_00112976:
                  uVar8 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
                  if (pdVar2->look_nbits[uVar8] == 0) {
                    min_bits = 9;
                    goto LAB_001129a9;
                  }
                  uVar4 = (uint)pdVar2->look_sym[uVar8];
                  bits_left = bits_left - pdVar2->look_nbits[uVar8];
                }
                uVar12 = uVar4 & 0xf;
                if (uVar12 == 0) {
                  if (uVar4 >> 4 != 0xf) goto LAB_00112b1c;
                  iVar6 = iVar6 + 0xf;
                }
                else {
                  if ((bits_left < (int)uVar12) &&
                     (bVar3 = jpeg_fill_bit_buffer
                                        (&local_a0,(bit_buf_type)get_buffer,bits_left,uVar12),
                     get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                     bits_left = local_a0.bits_left, bVar3 == 0)) goto LAB_00112b75;
                  bits_left = bits_left - uVar12;
                  uVar7 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[uVar12];
                  uVar5 = 0;
                  if ((int)uVar7 <= bmask[uVar12 - 1]) {
                    uVar5 = bmask[uVar12];
                  }
                  iVar6 = iVar6 + (uVar4 >> 4);
                  (*local_60)[local_38[iVar6]] = (short)uVar7 - (short)uVar5;
                }
                iVar6 = iVar6 + 1;
              } while (iVar6 < iVar11);
            }
          }
          for (; iVar6 <= local_74; iVar6 = iVar6 + iVar11 + 1) {
            if (bits_left < 8) {
              bVar3 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
              if (bVar3 == 0) {
                return 0;
              }
              get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
              bits_left = local_a0.bits_left;
              if (7 < local_a0.bits_left) goto LAB_00112a93;
              iVar11 = 1;
LAB_00112ac6:
              uVar4 = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,pdVar2,iVar11);
              uVar10 = (ulong)uVar4;
              get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
              bits_left = local_a0.bits_left;
              if ((int)uVar4 < 0) goto LAB_00112b75;
            }
            else {
LAB_00112a93:
              uVar8 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
              if (pdVar2->look_nbits[uVar8] == 0) {
                iVar11 = 9;
                goto LAB_00112ac6;
              }
              uVar10 = (ulong)pdVar2->look_sym[uVar8];
              bits_left = bits_left - pdVar2->look_nbits[uVar8];
            }
            iVar11 = (int)(uVar10 >> 4);
            uVar4 = (uint)uVar10 & 0xf;
            if ((uVar10 & 0xf) == 0) {
              if (iVar11 != 0xf) break;
            }
            else {
              if ((bits_left < (int)uVar4) &&
                 (bVar3 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,uVar4),
                 get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                 bits_left = local_a0.bits_left, bVar3 == 0)) goto LAB_00112b75;
              bits_left = bits_left - uVar4;
            }
          }
LAB_00112b1c:
          local_70 = local_70 + 1;
        } while (local_70 < local_68->blocks_in_MCU);
        pjVar9 = local_68->src;
      }
      pjVar9->next_input_byte = local_a0.next_input_byte;
      pjVar9->bytes_in_buffer = local_a0.bytes_in_buffer;
      pjVar1[1].start_pass = get_buffer;
      *(int *)&pjVar1[1].decode_mcu = bits_left;
      *(undefined4 *)&pjVar1[3].start_pass = local_48;
      pjVar1[2].start_pass = local_58;
      pjVar1[2].decode_mcu = p_Stack_50;
    }
    *(int *)&pjVar1[3].decode_mcu = *(int *)&pjVar1[3].decode_mcu + -1;
    bVar3 = 1;
  }
  else {
LAB_00112b75:
    bVar3 = 0;
  }
  return bVar3;
}

Assistant:

METHODDEF(boolean)
decode_mcu_sub (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  const int * natural_order;
  int Se, blkn;
  BITREAD_STATE_VARS;
  savable_state state;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    natural_order = cinfo->natural_order;
    Se = cinfo->lim_Se;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(state, entropy->saved);

    /* Outer loop handles each block in the MCU */

    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      JBLOCKROW block = MCU_data[blkn];
      d_derived_tbl * htbl;
      register int s, k, r;
      int coef_limit, ci;

      /* Decode a single block's worth of coefficients */

      /* Section F.2.2.1: decode the DC coefficient difference */
      htbl = entropy->dc_cur_tbls[blkn];
      HUFF_DECODE(s, br_state, htbl, return FALSE, label1);

      htbl = entropy->ac_cur_tbls[blkn];
      k = 1;
      coef_limit = entropy->coef_limit[blkn];
      if (coef_limit) {
	/* Convert DC difference to actual value, update last_dc_val */
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	}
	ci = cinfo->MCU_membership[blkn];
	s += state.last_dc_val[ci];
	state.last_dc_val[ci] = s;
	/* Output the DC coefficient */
	(*block)[0] = (JCOEF) s;

	/* Section F.2.2.2: decode the AC coefficients */
	/* Since zeroes are skipped, output area must be cleared beforehand */
	for (; k < coef_limit; k++) {
	  HUFF_DECODE(s, br_state, htbl, return FALSE, label2);

	  r = s >> 4;
	  s &= 15;

	  if (s) {
	    k += r;
	    CHECK_BIT_BUFFER(br_state, s, return FALSE);
	    r = GET_BITS(s);
	    s = HUFF_EXTEND(r, s);
	    /* Output coefficient in natural (dezigzagged) order.
	     * Note: the extra entries in natural_order[] will save us
	     * if k > Se, which could happen if the data is corrupted.
	     */
	    (*block)[natural_order[k]] = (JCOEF) s;
	  } else {
	    if (r != 15)
	      goto EndOfBlock;
	    k += 15;
	  }
	}
      } else {
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	}
      }

      /* Section F.2.2.2: decode the AC coefficients */
      /* In this path we just discard the values */
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, htbl, return FALSE, label3);

	r = s >> 4;
	s &= 15;

	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	} else {
	  if (r != 15)
	    break;
	  k += 15;
	}
      }

      EndOfBlock: ;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(entropy->saved, state);
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}